

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O3

void golf_shader_uniform_set_vec2(golf_shader_uniform_t *uniform,char *name,vec2 v)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  golf_shader_uniform_member_t *pgVar4;
  golf_shader_uniform_member_t *__s1;
  float local_38;
  float fStack_34;
  
  lVar3 = (long)(uniform->members).length;
  if (0 < lVar3) {
    __s1 = (uniform->members).data;
    pgVar4 = (golf_shader_uniform_member_t *)0x0;
    do {
      iVar2 = strcmp(__s1->name,name);
      if ((iVar2 == 0) && (__s1->size == 8)) {
        pgVar4 = __s1;
      }
      __s1 = __s1 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    local_38 = v.x;
    fStack_34 = v.y;
    if (pgVar4 != (golf_shader_uniform_member_t *)0x0) {
      pcVar1 = uniform->data;
      iVar2 = pgVar4->offset;
      *(float *)(pcVar1 + iVar2) = local_38;
      *(float *)((long)(pcVar1 + iVar2) + 4) = fStack_34;
      return;
    }
  }
  golf_log_warning("Unable to find vec2 member: %s",name);
  return;
}

Assistant:

void golf_shader_uniform_set_vec2(golf_shader_uniform_t *uniform, const char *name, vec2 v) {
    golf_shader_uniform_member_t *member = NULL;
    for (int i = 0; i < uniform->members.length; i++) {
        if ((strcmp(uniform->members.data[i].name, name) == 0) && uniform->members.data[i].size == 8) {
            member = &uniform->members.data[i];
        }
    }
    if (!member) {
        golf_log_warning("Unable to find vec2 member: %s", name);
        return;
    }
    memcpy(uniform->data + member->offset, &v, 8);
}